

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[58],kj::StringPtr,char_const(&)[67],kj::StringPtr,char_const(&)[94]>
          (String *__return_storage_ptr__,kj *this,char (*params) [58],StringPtr *params_1,
          char (*params_2) [67],StringPtr *params_3,char (*params_4) [94])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff78;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_40 = toCharSequence<char_const(&)[58]>((char (*) [58])this);
  local_50.ptr = *(char **)*params;
  local_50.size_ = *(long *)(*params + 8) - 1;
  local_60 = toCharSequence<char_const(&)[67]>((char (*) [67])params_1);
  local_70.ptr = *(char **)*params_2;
  local_70.size_ = *(long *)(*params_2 + 8) - 1;
  local_80 = toCharSequence<char_const(&)[94]>((char (*) [94])params_3);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,&local_70,&local_80,
             in_stack_ffffffffffffff78);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}